

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

__m128i paeth_8x1_pred(__m128i *left,__m128i *top,__m128i *topleft)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  longlong in_RAX;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  short sVar27;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  undefined1 auVar28 [16];
  undefined1 in_XMM5 [16];
  __m128i alVar36;
  
  sVar1 = (short)(*top)[0];
  sVar2 = *(short *)((long)*top + 2);
  sVar3 = *(short *)((long)*top + 4);
  sVar4 = *(short *)((long)*top + 6);
  sVar5 = (short)(*top)[1];
  sVar6 = *(short *)((long)*top + 10);
  sVar7 = *(short *)((long)*top + 0xc);
  sVar8 = *(short *)((long)*top + 0xe);
  sVar9 = (short)(*left)[0];
  sVar10 = *(short *)((long)*left + 2);
  sVar11 = *(short *)((long)*left + 4);
  sVar12 = *(short *)((long)*left + 6);
  sVar13 = (short)(*left)[1];
  sVar14 = *(short *)((long)*left + 10);
  sVar15 = *(short *)((long)*left + 0xc);
  sVar16 = *(short *)((long)*left + 0xe);
  sVar17 = (short)(*topleft)[0];
  sVar18 = *(short *)((long)*topleft + 2);
  sVar19 = *(short *)((long)*topleft + 4);
  sVar20 = *(short *)((long)*topleft + 6);
  sVar21 = (short)(*topleft)[1];
  sVar22 = *(short *)((long)*topleft + 10);
  sVar23 = *(short *)((long)*topleft + 0xc);
  sVar24 = *(short *)((long)*topleft + 0xe);
  sVar27 = (sVar1 + sVar9) - sVar17;
  sVar29 = (sVar2 + sVar10) - sVar18;
  sVar30 = (sVar3 + sVar11) - sVar19;
  sVar31 = (sVar4 + sVar12) - sVar20;
  sVar32 = (sVar5 + sVar13) - sVar21;
  sVar33 = (sVar6 + sVar14) - sVar22;
  sVar34 = (sVar7 + sVar15) - sVar23;
  sVar35 = (sVar8 + sVar16) - sVar24;
  auVar25._0_2_ = sVar27 - sVar9;
  auVar25._2_2_ = sVar29 - sVar10;
  auVar25._4_2_ = sVar30 - sVar11;
  auVar25._6_2_ = sVar31 - sVar12;
  auVar25._8_2_ = sVar32 - sVar13;
  auVar25._10_2_ = sVar33 - sVar14;
  auVar25._12_2_ = sVar34 - sVar15;
  auVar25._14_2_ = sVar35 - sVar16;
  pabsw(in_XMM5,auVar25);
  auVar26._0_2_ = sVar27 - sVar1;
  auVar26._2_2_ = sVar29 - sVar2;
  auVar26._4_2_ = sVar30 - sVar3;
  auVar26._6_2_ = sVar31 - sVar4;
  auVar26._8_2_ = sVar32 - sVar5;
  auVar26._10_2_ = sVar33 - sVar6;
  auVar26._12_2_ = sVar34 - sVar7;
  auVar26._14_2_ = sVar35 - sVar8;
  pabsw(auVar26,auVar26);
  auVar28._0_2_ = sVar27 - sVar17;
  auVar28._2_2_ = sVar29 - sVar18;
  auVar28._4_2_ = sVar30 - sVar19;
  auVar28._6_2_ = sVar31 - sVar20;
  auVar28._8_2_ = sVar32 - sVar21;
  auVar28._10_2_ = sVar33 - sVar22;
  auVar28._12_2_ = sVar34 - sVar23;
  auVar28._14_2_ = sVar35 - sVar24;
  pabsw(auVar28,auVar28);
  alVar36[1] = (longlong)topleft;
  alVar36[0] = in_RAX;
  return alVar36;
}

Assistant:

static inline __m128i paeth_8x1_pred(const __m128i *left, const __m128i *top,
                                     const __m128i *topleft) {
  const __m128i base = _mm_sub_epi16(_mm_add_epi16(*top, *left), *topleft);

  __m128i pl = _mm_abs_epi16(_mm_sub_epi16(base, *left));
  __m128i pt = _mm_abs_epi16(_mm_sub_epi16(base, *top));
  __m128i ptl = _mm_abs_epi16(_mm_sub_epi16(base, *topleft));

  __m128i mask1 = _mm_cmpgt_epi16(pl, pt);
  mask1 = _mm_or_si128(mask1, _mm_cmpgt_epi16(pl, ptl));
  __m128i mask2 = _mm_cmpgt_epi16(pt, ptl);

  pl = _mm_andnot_si128(mask1, *left);

  ptl = _mm_and_si128(mask2, *topleft);
  pt = _mm_andnot_si128(mask2, *top);
  pt = _mm_or_si128(pt, ptl);
  pt = _mm_and_si128(mask1, pt);

  return _mm_or_si128(pl, pt);
}